

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O0

void mayer_dofft(t_sample *fz1,t_sample *fz2,int n,int sgn)

{
  double *a;
  int iVar1;
  float *local_48;
  t_sample *fp2;
  t_sample *fp1;
  double *pdStack_30;
  int i;
  double *fp3;
  double *buf;
  int sgn_local;
  int n_local;
  t_sample *fz2_local;
  t_sample *fz1_local;
  
  iVar1 = ooura_init(n << 1);
  a = ooura_buffer;
  if (iVar1 != 0) {
    pdStack_30 = ooura_buffer;
    local_48 = fz2;
    fp2 = fz1;
    for (fp1._4_4_ = 0; fp1._4_4_ < n; fp1._4_4_ = fp1._4_4_ + 1) {
      *pdStack_30 = (double)*fp2;
      pdStack_30[1] = (double)*local_48;
      pdStack_30 = pdStack_30 + 2;
      local_48 = local_48 + 1;
      fp2 = fp2 + 1;
    }
    cdft(n << 1,sgn,a,ooura_bitrev,ooura_costab);
    pdStack_30 = a;
    local_48 = fz2;
    fp2 = fz1;
    for (fp1._4_4_ = 0; fp1._4_4_ < n; fp1._4_4_ = fp1._4_4_ + 1) {
      *fp2 = (float)*pdStack_30;
      *local_48 = (float)pdStack_30[1];
      pdStack_30 = pdStack_30 + 2;
      local_48 = local_48 + 1;
      fp2 = fp2 + 1;
    }
  }
  return;
}

Assistant:

EXTERN void mayer_dofft(t_sample *fz1, t_sample *fz2, int n, int sgn)
{
    FFTFLT *buf, *fp3;
    int i;
    t_sample *fp1, *fp2;
    if (!ooura_init(2*n))
        return;
    buf = ooura_buffer;
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        fp3[0] = *fp1++;
        fp3[1] = *fp2++;
        fp3 += 2;
    }
    cdft(2*n, sgn, buf, ooura_bitrev, ooura_costab);
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        *fp1++ = fp3[0];
        *fp2++ = fp3[1];
        fp3 += 2;
    }
}